

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall
dxil_spv::SPIRVModule::Impl::get_helper_call_id
          (Impl *this,SPIRVModule *module,HelperCall call,Id *aux_ids,uint32_t aux_ids_count)

{
  uint32_t aux_ids_count_local;
  Id *aux_ids_local;
  HelperCall call_local;
  SPIRVModule *module_local;
  Impl *this_local;
  
  switch(call) {
  case NodeCoalescePayloadOffset:
    this_local._4_4_ = build_node_coalesce_payload_offset(this,module,aux_ids,aux_ids_count);
    break;
  default:
    this_local._4_4_ = 0;
    break;
  case CoopMatFP8toFP16:
    this_local._4_4_ = build_coop_mat_fp8_to_fp16(this,module,aux_ids,aux_ids_count);
    break;
  case CoopMatFP16toFP8:
    this_local._4_4_ = build_coop_mat_fp16_to_fp8(this,module,aux_ids,aux_ids_count);
    break;
  case CoopMatTransfer:
    this_local._4_4_ = build_coop_mat_transfer(this,module,aux_ids,aux_ids_count);
  }
  return this_local._4_4_;
}

Assistant:

spv::Id SPIRVModule::Impl::get_helper_call_id(SPIRVModule &module, HelperCall call,
                                              const spv::Id *aux_ids, uint32_t aux_ids_count)
{
	switch (call)
	{
	case HelperCall::NodeCoalescePayloadOffset:
		return build_node_coalesce_payload_offset(module, aux_ids, aux_ids_count);
	case HelperCall::CoopMatFP8toFP16:
		return build_coop_mat_fp8_to_fp16(module, aux_ids, aux_ids_count);
	case HelperCall::CoopMatFP16toFP8:
		return build_coop_mat_fp16_to_fp8(module, aux_ids, aux_ids_count);
	case HelperCall::CoopMatTransfer:
		return build_coop_mat_transfer(module, aux_ids, aux_ids_count);
	default:
		break;
	}
	return 0;
}